

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

EnumDescriptorProto * __thiscall
google::protobuf::descriptor_unittest::AddEnum
          (descriptor_unittest *this,FileDescriptorProto *file,string_view name)

{
  string_view value;
  EnumDescriptorProto *this_00;
  uint32_t *puVar1;
  Arena *arena;
  EnumDescriptorProto *result;
  FileDescriptorProto *file_local;
  string_view name_local;
  
  this_00 = FileDescriptorProto::add_enum_type((FileDescriptorProto *)this);
  puVar1 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  value._M_str = (char *)name._M_len;
  value._M_len = (size_t)file;
  internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.name_,value,arena);
  return this_00;
}

Assistant:

EnumDescriptorProto* AddEnum(FileDescriptorProto* file,
                             absl::string_view name) {
  EnumDescriptorProto* result = file->add_enum_type();
  result->set_name(name);
  return result;
}